

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-error.c
# Opt level: O0

int run_test_pipe_connect_bad_name(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_170 [4];
  int r;
  uv_connect_t req;
  uv_pipe_t client;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)(req.queue + 1),0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-connect-error.c"
            ,0x41,"r == 0");
    abort();
  }
  uv_pipe_connect((uv_connect_t *)local_170,(uv_pipe_t *)(req.queue + 1),
                  "/path/to/unix/socket/that/really/should/not/be/there",connect_cb);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-connect-error.c"
            ,0x46,"close_cb_called == 1");
    abort();
  }
  if (connect_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-connect-error.c"
            ,0x47,"connect_cb_called == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-connect-error.c"
            ,0x49,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(pipe_connect_bad_name) {
  uv_pipe_t client;
  uv_connect_t req;
  int r;

  r = uv_pipe_init(uv_default_loop(), &client, 0);
  ASSERT(r == 0);
  uv_pipe_connect(&req, &client, BAD_PIPENAME, connect_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);
  ASSERT(connect_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}